

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier.cpp
# Opt level: O2

void __thiscall
embree::barrier_sys_regression_test::barrier_sys_regression_test(barrier_sys_regression_test *this)

{
  RegressionTest *in_stack_ffffffffffffffb8;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"barrier_sys_regression_test",&local_39);
  RegressionTest::RegressionTest(&this->super_RegressionTest,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_RegressionTest)._vptr_RegressionTest = (_func_int **)&PTR_run_002ab368;
  BarrierSys::BarrierSys(&this->barrier,0);
  (this->threadResults).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->threadResults).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->threadID).super___atomic_base<unsigned_long>._M_i = 0;
  (this->numFailed).super___atomic_base<unsigned_long>._M_i = 0;
  (this->threadResults).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  registerRegressionTest(in_stack_ffffffffffffffb8);
  return;
}

Assistant:

barrier_sys_regression_test() 
      : RegressionTest("barrier_sys_regression_test"), threadID(0), numFailed(0)
    {
      registerRegressionTest(this);
    }